

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O1

bool wallet::EncryptSecret
               (CKeyingMaterial *vMasterKey,CKeyingMaterial *vchPlaintext,uint256 *nIV,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCiphertext)

{
  undefined8 uVar1;
  bool bVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> new_iv;
  CCrypter cKeyCrypter;
  CCrypter local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CCrypter::CCrypter(&local_70);
  puVar3 = (pointer)operator_new(0x10);
  uVar1 = *(undefined8 *)((nIV->super_base_blob<256U>).m_data._M_elems + 8);
  *(undefined8 *)puVar3 = *(undefined8 *)(nIV->super_base_blob<256U>).m_data._M_elems;
  *(undefined8 *)(puVar3 + 8) = uVar1;
  new_iv._M_extent._M_extent_value = 0x10;
  new_iv._M_ptr = puVar3;
  bVar2 = CCrypter::SetKey(&local_70,vMasterKey,new_iv);
  if (bVar2) {
    bVar2 = CCrypter::Encrypt(&local_70,vchPlaintext,vchCiphertext);
  }
  else {
    bVar2 = false;
  }
  operator_delete(puVar3,0x10);
  CCrypter::~CCrypter(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool EncryptSecret(const CKeyingMaterial& vMasterKey, const CKeyingMaterial &vchPlaintext, const uint256& nIV, std::vector<unsigned char> &vchCiphertext)
{
    CCrypter cKeyCrypter;
    std::vector<unsigned char> chIV(WALLET_CRYPTO_IV_SIZE);
    memcpy(chIV.data(), &nIV, WALLET_CRYPTO_IV_SIZE);
    if(!cKeyCrypter.SetKey(vMasterKey, chIV))
        return false;
    return cKeyCrypter.Encrypt(vchPlaintext, vchCiphertext);
}